

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoTransfer.c
# Opt level: O3

DdNode * reoTransferUnitsToNodes_rec(reo_man *p,reo_unit *pUnit)

{
  int *piVar1;
  DdManager *unique;
  reo_hash *prVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  reo_unit *n;
  DdNode *T;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  DdNode *pDVar10;
  reo_unit *prVar11;
  
  unique = p->dd;
  uVar9 = (ulong)((uint)pUnit & 1);
  prVar11 = (reo_unit *)((ulong)pUnit & 0xfffffffffffffffe);
  uVar8 = 0xffffffff;
  if (prVar11->n != 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)p->nTableSize;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)prVar11 * 0xc00005 + (long)p->Signature;
    uVar8 = SUB168(auVar4 % auVar3,0);
    prVar2 = p->HTable;
    lVar6 = (long)SUB164(auVar4 % auVar3,0);
    iVar5 = prVar2[lVar6].Sign;
    while (iVar5 == p->Signature) {
      if (prVar2[lVar6].Arg1 == prVar11) {
        if (prVar2[lVar6].Arg2 != (reo_unit *)0x0) {
          return (DdNode *)(uVar9 ^ (ulong)prVar2[lVar6].Arg2);
        }
        __assert_fail("bRes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoTransfer.c"
                      ,0x89,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
      }
      uVar7 = (long)((int)uVar8 + 1) % (long)p->nTableSize;
      uVar8 = uVar7 & 0xffffffff;
      lVar6 = (long)(int)uVar7;
      iVar5 = prVar2[lVar6].Sign;
    }
  }
  if (prVar11->lev == 30000) {
    n = (reo_unit *)cuddUniqueConst(unique,(double)(int)prVar11->pE);
    uVar7 = (ulong)n & 0xfffffffffffffffe;
    iVar5 = 1;
LAB_0081f997:
    *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + iVar5;
    if (prVar11->n != 1) {
      prVar2 = p->HTable;
      iVar5 = p->Signature;
      lVar6 = (long)(int)uVar8;
      if (prVar2[lVar6].Sign == iVar5) {
        do {
          uVar7 = (long)((int)uVar8 + 1) % (long)p->nTableSize;
          uVar8 = uVar7 & 0xffffffff;
          lVar6 = (long)(int)uVar7;
        } while (prVar2[lVar6].Sign == iVar5);
      }
      prVar2[lVar6].Sign = iVar5;
      prVar2[lVar6].Arg1 = prVar11;
      prVar2[lVar6].Arg2 = n;
      iVar5 = p->nRefNodes;
      p->nRefNodes = iVar5 + 1;
      p->pRefNodes[iVar5] = (DdNode *)n;
      Cudd_Ref((DdNode *)n);
    }
    p->nNodesCur = p->nNodesCur + 1;
    pDVar10 = (DdNode *)(uVar9 ^ (ulong)n);
    piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  else {
    pDVar10 = reoTransferUnitsToNodes_rec(p,prVar11->pE);
    if (pDVar10 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      T = reoTransferUnitsToNodes_rec(p,prVar11->pT);
      if (T != (DdNode *)0x0) {
        uVar7 = (ulong)T & 0xfffffffffffffffe;
        *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
        if (pDVar10 == T) {
          __assert_fail("E != T",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoTransfer.c"
                        ,0xa5,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
        }
        if (((ulong)T & 1) != 0) {
          __assert_fail("!Cudd_IsComplement(T)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoTransfer.c"
                        ,0xa6,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
        }
        n = (reo_unit *)cuddUniqueInter(unique,p->pMapToDdVarsFinal[prVar11->lev],T,pDVar10);
        if (n != (reo_unit *)0x0) {
          piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          iVar5 = -1;
          goto LAB_0081f997;
        }
        Cudd_RecursiveDeref(unique,pDVar10);
        pDVar10 = T;
      }
      Cudd_RecursiveDeref(unique,pDVar10);
    }
    pDVar10 = (DdNode *)0x0;
  }
  return pDVar10;
}

Assistant:

DdNode * reoTransferUnitsToNodes_rec( reo_man * p, reo_unit * pUnit )
{
    DdManager * dd = p->dd;
    DdNode * bRes, * E, * T;
    int HKey = -1; // Suppress "might be used uninitialized"
        int fComp;

    fComp = Cudd_IsComplement(pUnit);
    pUnit = Unit_Regular(pUnit);

    // check the hash-table
    if ( pUnit->n != 1 )
    {
        for ( HKey = hashKey2(p->Signature,pUnit,p->nTableSize); p->HTable[HKey].Sign == p->Signature; HKey = (HKey+1) % p->nTableSize )
            if ( p->HTable[HKey].Arg1 == pUnit )
            {
                bRes = (DdNode*) p->HTable[HKey].Arg2;  
                assert( bRes );
                return Cudd_NotCond( bRes, fComp );
            }
    }

    // treat the case of constants
    if ( Unit_IsConstant(pUnit) )
    {
        bRes = cuddUniqueConst( dd, ((double)((int)(ABC_PTRUINT_T)(pUnit->pE))) );
        cuddRef( bRes );
    }
    else
    {
        // split and recur on children of this node
        E = reoTransferUnitsToNodes_rec( p, pUnit->pE );
        if ( E == NULL )
            return NULL;
        cuddRef(E);

        T = reoTransferUnitsToNodes_rec( p, pUnit->pT );
        if ( T == NULL )
        {
            Cudd_RecursiveDeref(dd, E);
            return NULL;
        }
        cuddRef(T);
        
        // consider the case when Res0 and Res1 are the same node
        assert( E != T );
        assert( !Cudd_IsComplement(T) );

        bRes = cuddUniqueInter( dd, p->pMapToDdVarsFinal[pUnit->lev], T, E );
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref(dd,E);
            Cudd_RecursiveDeref(dd,T);
            return NULL;
        }
        cuddRef( bRes );
        cuddDeref( E );
        cuddDeref( T );
    }

    // do not keep the result if the ref count is only 1, since it will not be visited again
    if ( pUnit->n != 1 )
    {
         // while we traversed the diagram, the hash entry to which HKey points,
         // might have been used. Make sure that its signature is different.
         for ( ; p->HTable[HKey].Sign == p->Signature; HKey = (HKey+1) % p->nTableSize );
         p->HTable[HKey].Sign = p->Signature;
         p->HTable[HKey].Arg1 = pUnit;
         p->HTable[HKey].Arg2 = (reo_unit *)bRes;  

         // add the DD to the referenced DD list in order to be able to store it in cache
         p->pRefNodes[p->nRefNodes++] = bRes;  Cudd_Ref( bRes ); 
         // no need to do this, because the garbage collection will not take bRes away
         // it is held by the diagram in the making
    }
    // increment the counter of nodes
    p->nNodesCur++;
    cuddDeref( bRes );
    return Cudd_NotCond( bRes, fComp );
}